

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

void quicly_free(quicly_conn_t *conn)

{
  undefined8 *__ptr;
  int iVar1;
  void *in_RDI;
  st_quicly_pending_path_challenge_t *pending;
  quicly_conn_t *_conn_1;
  quicly_stats_t stats;
  quicly_conn_t *_conn;
  undefined4 in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  quicly_conn_t *in_stack_fffffffffffffdb0;
  void *in_stack_fffffffffffffdb8;
  quicly_conn_t *in_stack_fffffffffffffdc0;
  ptls_buffer_t *in_stack_fffffffffffffdd0;
  ptls_t *in_stack_fffffffffffffdf0;
  
  lock_now(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
  if ((quicly_trace_fp != (FILE *)0x0) &&
     (iVar1 = ptls_skip_tracing(*(ptls_t **)((long)in_RDI + 0x8b0)), iVar1 == 0)) {
    QUICLY_FREE(in_stack_fffffffffffffdc0,(int64_t)in_stack_fffffffffffffdb8);
  }
  if (((quicly_trace_fp != (FILE *)0x0) &&
      (quicly_get_stats(in_stack_fffffffffffffdb0,
                        (quicly_stats_t *)
                        CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)),
      in_stack_fffffffffffffdb8 = in_RDI, quicly_trace_fp != (FILE *)0x0)) &&
     (iVar1 = ptls_skip_tracing(*(ptls_t **)((long)in_RDI + 0x8b0)), iVar1 == 0)) {
    QUICLY_CONN_STATS((st_quicly_conn_t *)stats.num_frames_received.streams_blocked,
                      stats.num_frames_received.stream_data_blocked,
                      (st_quicly_stats_t *)stats.num_frames_received.data_blocked,
                      stats.num_frames_received.max_streams_uni);
  }
  update_open_count((quicly_context_t *)in_stack_fffffffffffffdb0,
                    CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  destroy_all_streams(in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                      (int)in_stack_fffffffffffffdb8);
  clear_datagram_frame_payloads(in_stack_fffffffffffffdc0);
  quicly_maxsender_dispose((quicly_maxsender_t *)((long)in_RDI + 0x558));
  quicly_maxsender_dispose((quicly_maxsender_t *)((long)in_RDI + 0x578));
  quicly_maxsender_dispose((quicly_maxsender_t *)((long)in_RDI + 0x598));
  while (*(long *)((long)in_RDI + 0x6f0) != 0) {
    __ptr = *(undefined8 **)((long)in_RDI + 0x6f0);
    *(undefined8 *)((long)in_RDI + 0x6f0) = *__ptr;
    free(__ptr);
  }
  quicly_loss_dispose((quicly_loss_t *)0x1319ed);
  kh_destroy_quicly_stream_t((kh_quicly_stream_t_t *)0x131a01);
  iVar1 = quicly_linklist_is_linked((quicly_linklist_t *)((long)in_RDI + 0x788));
  if (iVar1 != 0) {
    __assert_fail("!quicly_linklist_is_linked(&conn->egress.pending_streams.blocked.uni)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x61d,"void quicly_free(quicly_conn_t *)");
  }
  iVar1 = quicly_linklist_is_linked((quicly_linklist_t *)((long)in_RDI + 0x798));
  if (iVar1 != 0) {
    __assert_fail("!quicly_linklist_is_linked(&conn->egress.pending_streams.blocked.bidi)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x61e,"void quicly_free(quicly_conn_t *)");
  }
  iVar1 = quicly_linklist_is_linked((quicly_linklist_t *)((long)in_RDI + 0x7a8));
  if (iVar1 != 0) {
    __assert_fail("!quicly_linklist_is_linked(&conn->egress.pending_streams.control)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x61f,"void quicly_free(quicly_conn_t *)");
  }
  iVar1 = quicly_linklist_is_linked((quicly_linklist_t *)((long)in_RDI + 800));
  if (iVar1 != 0) {
    __assert_fail("!quicly_linklist_is_linked(&conn->super._default_scheduler.active)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x620,"void quicly_free(quicly_conn_t *)");
  }
  iVar1 = quicly_linklist_is_linked((quicly_linklist_t *)((long)in_RDI + 0x330));
  if (iVar1 != 0) {
    __assert_fail("!quicly_linklist_is_linked(&conn->super._default_scheduler.blocked)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x621,"void quicly_free(quicly_conn_t *)");
  }
  free_handshake_space((st_quicly_handshake_space_t **)0x131b58);
  free_handshake_space((st_quicly_handshake_space_t **)0x131b6c);
  free_application_space((st_quicly_application_space_t **)0x131b80);
  ptls_buffer_dispose(in_stack_fffffffffffffdd0);
  ptls_free(in_stack_fffffffffffffdf0);
  unlock_now((quicly_conn_t *)0x131bc0);
  free(*(void **)((long)in_RDI + 0x988));
  free(in_RDI);
  return;
}

Assistant:

void quicly_free(quicly_conn_t *conn)
{
    lock_now(conn, 0);

    QUICLY_PROBE(FREE, conn, conn->stash.now);

#if QUICLY_USE_EMBEDDED_PROBES || QUICLY_USE_DTRACE
    if (QUICLY_CONN_STATS_ENABLED()) {
        quicly_stats_t stats;
        quicly_get_stats(conn, &stats);
        QUICLY_PROBE(CONN_STATS, conn, conn->stash.now, &stats, sizeof(stats));
    }
#endif
    update_open_count(conn->super.ctx, -1);

    destroy_all_streams(conn, 0, 1);
    clear_datagram_frame_payloads(conn);

    quicly_maxsender_dispose(&conn->ingress.max_data.sender);
    quicly_maxsender_dispose(&conn->ingress.max_streams.uni);
    quicly_maxsender_dispose(&conn->ingress.max_streams.bidi);
    while (conn->egress.path_challenge.head != NULL) {
        struct st_quicly_pending_path_challenge_t *pending = conn->egress.path_challenge.head;
        conn->egress.path_challenge.head = pending->next;
        free(pending);
    }
    quicly_loss_dispose(&conn->egress.loss);

    kh_destroy(quicly_stream_t, conn->streams);

    assert(!quicly_linklist_is_linked(&conn->egress.pending_streams.blocked.uni));
    assert(!quicly_linklist_is_linked(&conn->egress.pending_streams.blocked.bidi));
    assert(!quicly_linklist_is_linked(&conn->egress.pending_streams.control));
    assert(!quicly_linklist_is_linked(&conn->super._default_scheduler.active));
    assert(!quicly_linklist_is_linked(&conn->super._default_scheduler.blocked));

    free_handshake_space(&conn->initial);
    free_handshake_space(&conn->handshake);
    free_application_space(&conn->application);

    ptls_buffer_dispose(&conn->crypto.transport_params.buf);
    ptls_free(conn->crypto.tls);

    unlock_now(conn);

    free(conn->token.base);
    free(conn);
}